

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamfortestoutput.h
# Opt level: O2

char UnitTests::escape_it(char c)

{
  byte bVar1;
  
  bVar1 = (byte)((byte)c - 9);
  if ((bVar1 < 5) && ((0x17U >> ((byte)c - 9 & 0x1f) & 1) != 0)) {
    c = (char)(0x726e766e74 >> ((bVar1 & 7) << 3));
  }
  return c;
}

Assistant:

inline char escape_it(char c)
    {
        switch (c)
        {
            case '\n':
                return 'n';
            case '\t':
                return 't';
            case '\r':
                return 'r';
            case '\v':
                return 'v';
            default:
                return c;
        }
    }